

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

void LTACMasterdataChannel::RegisterMasterDataChn(LTACMasterdataChannel *pChn,bool bToFrontOfQueue)

{
  int iVar1;
  _List_node_base *p_Var2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mtxMaster);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  p_Var2 = lstChn_abi_cxx11_.
           super__List_base<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (lstChn_abi_cxx11_.
      super__List_base<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&lstChn_abi_cxx11_) {
    do {
      if ((LTACMasterdataChannel *)p_Var2[1]._M_next == pChn) break;
      p_Var2 = (((_List_base<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *)
                &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)&lstChn_abi_cxx11_);
    if (p_Var2 != (_List_node_base *)&lstChn_abi_cxx11_) goto LAB_00167db9;
  }
  if (bToFrontOfQueue) {
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)pChn;
  }
  else {
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)pChn;
  }
  std::__detail::_List_node_base::_M_hook(p_Var2);
  lstChn_abi_cxx11_.
  super__List_base<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>._M_impl.
  _M_node._M_size =
       lstChn_abi_cxx11_.
       super__List_base<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>._M_impl.
       _M_node._M_size + 1;
LAB_00167db9:
  pthread_mutex_unlock((pthread_mutex_t *)&mtxMaster);
  return;
}

Assistant:

void LTACMasterdataChannel::RegisterMasterDataChn (LTACMasterdataChannel* pChn,
                                                   bool bToFrontOfQueue)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        // just add the channel to the list of channels
        if (std::find(lstChn.begin(), lstChn.end(), pChn) == lstChn.end()) {
            if (bToFrontOfQueue)
                lstChn.push_front(pChn);
            else
                lstChn.push_back(pChn);
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
}